

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SetColorEditOptions(ImGuiColorEditFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiContext *g;
  ImGuiColorEditFlags flags_local;
  
  pIVar1 = GImGui;
  g._4_4_ = flags;
  if ((flags & 0x700000U) == 0) {
    g._4_4_ = flags | 0x100000;
  }
  if ((g._4_4_ & 0x1800000) == 0) {
    g._4_4_ = g._4_4_ | 0x800000;
  }
  if ((g._4_4_ & 0x6000000) == 0) {
    g._4_4_ = g._4_4_ | 0x2000000;
  }
  if ((g._4_4_ & 0x18000000) == 0) {
    g._4_4_ = g._4_4_ | 0x8000000;
  }
  bVar2 = ImIsPowerOfTwo(g._4_4_ & 0x700000);
  if (!bVar2) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DisplayMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                  ,0x14e8,"void ImGui::SetColorEditOptions(ImGuiColorEditFlags)");
  }
  bVar2 = ImIsPowerOfTwo(g._4_4_ & 0x1800000);
  if (!bVar2) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DataTypeMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                  ,0x14e9,"void ImGui::SetColorEditOptions(ImGuiColorEditFlags)");
  }
  bVar2 = ImIsPowerOfTwo(g._4_4_ & 0x6000000);
  if (!bVar2) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                  ,0x14ea,"void ImGui::SetColorEditOptions(ImGuiColorEditFlags)");
  }
  bVar2 = ImIsPowerOfTwo(g._4_4_ & 0x18000000);
  if (!bVar2) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                  ,0x14eb,"void ImGui::SetColorEditOptions(ImGuiColorEditFlags)");
  }
  pIVar1->ColorEditOptions = g._4_4_;
  return;
}

Assistant:

void ImGui::SetColorEditOptions(ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;
    if ((flags & ImGuiColorEditFlags__DisplayMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__DisplayMask;
    if ((flags & ImGuiColorEditFlags__DataTypeMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__DataTypeMask;
    if ((flags & ImGuiColorEditFlags__PickerMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__PickerMask;
    if ((flags & ImGuiColorEditFlags__InputMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DisplayMask));    // Check only 1 option is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DataTypeMask));   // Check only 1 option is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask));     // Check only 1 option is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));      // Check only 1 option is selected
    g.ColorEditOptions = flags;
}